

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resampler.c
# Opt level: O3

void Resmpl_ChangeRate(void *DataPtr,UINT32 newSmplRate)

{
  RESMPL_STATE *CAA;
  
  if (*DataPtr != newSmplRate) {
    *(UINT32 *)DataPtr = newSmplRate;
    Resmpl_ChooseResampler((RESMPL_STATE *)DataPtr);
    *(undefined8 *)((long)DataPtr + 0x28) = 1;
    *(int *)((long)DataPtr + 0x30) = *(int *)((long)DataPtr + 0x30) - *(int *)((long)DataPtr + 0x2c)
    ;
  }
  return;
}

Assistant:

void Resmpl_ChangeRate(void* DataPtr, UINT32 newSmplRate)
{
	RESMPL_STATE* CAA = (RESMPL_STATE*)DataPtr;
	
	if (CAA->smpRateSrc == newSmplRate)
		return;
	
	// quick and dirty hack to make sample rate changes work
	CAA->smpRateSrc = newSmplRate;
	Resmpl_ChooseResampler(CAA);
	CAA->smpP = 1;
	CAA->smpNext -= CAA->smpLast;
	CAA->smpLast = 0x00;
	
	return;
}